

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibrary.cpp
# Opt level: O2

void __thiscall QLibraryPrivate::setLoadHints(QLibraryPrivate *this,LoadHints lh)

{
  long in_FS_OFFSET;
  undefined1 local_28 [16];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->fileName).d.size == 0) {
    (this->loadHintsInt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (__int_type_conflict)
         lh.super_QFlagsStorageHelper<QLibrary::LoadHint,_4>.super_QFlagsStorage<QLibrary::LoadHint>
         .i;
  }
  else {
    local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_28._0_8_ = &qt_library_mutex;
    QBasicMutex::lock(&qt_library_mutex);
    local_28[8] = true;
    if ((this->pHnd).super_QBasicAtomicPointer<void>._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      (this->loadHintsInt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (this->loadHintsInt).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i |
           (uint)lh.super_QFlagsStorageHelper<QLibrary::LoadHint,_4>.
                 super_QFlagsStorage<QLibrary::LoadHint>.i;
      UNLOCK();
    }
    QMutexLocker<QBasicMutex>::~QMutexLocker((QMutexLocker<QBasicMutex> *)local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLibraryPrivate::setLoadHints(QLibrary::LoadHints lh)
{
    // Set the load hints directly for a dummy if this object is not associated
    // with a file. Such object is not shared between multiple instances.
    if (fileName.isEmpty()) {
        loadHintsInt.storeRelaxed(lh.toInt());
        return;
    }

    // this locks a global mutex
    QMutexLocker lock(&qt_library_mutex);
    mergeLoadHints(lh);
}